

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_astrip(CHAR_DATA *ch,char *argument)

{
  AFFECT_DATA *pAVar1;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var2;
  char arg [4608];
  AFFECT_DATA *af_next;
  AFFECT_DATA *af;
  CHAR_DATA *victim;
  char *in_stack_ffffffffffffedc8;
  char *in_stack_ffffffffffffedd0;
  char in_stack_ffffffffffffedd8;
  undefined7 in_stack_ffffffffffffedd9;
  char *in_stack_ffffffffffffede0;
  AFFECT_DATA *in_stack_ffffffffffffee08;
  CHAR_DATA *in_stack_ffffffffffffee10;
  AFFECT_DATA *local_20;
  CHAR_DATA *local_18;
  
  one_argument(in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
  local_18 = in_RDI;
  if (in_stack_ffffffffffffedd8 != '\0') {
    local_18 = get_char_world((CHAR_DATA *)arg._4552_8_,(char *)arg._4544_8_);
  }
  if (local_18 == (CHAR_DATA *)0x0) {
    send_to_char(in_stack_ffffffffffffede0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
  }
  else {
    local_20 = local_18->affected;
    while (local_20 != (AFFECT_DATA *)0x0) {
      pAVar1 = local_20->next;
      in_stack_ffffffffffffedd0 = (char *)local_20->bitvector[0];
      _Var2 = std::pow<int,int>(0,0x599a78);
      local_20 = pAVar1;
      if (((ulong)in_stack_ffffffffffffedd0 & (long)_Var2) == 0) {
        affect_remove(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
      }
    }
    if (local_18 == in_RDI) {
      send_to_char(in_stack_ffffffffffffede0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
    }
    else {
      act(in_stack_ffffffffffffede0,
          (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8),
          in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,0);
    }
  }
  return;
}

Assistant:

void do_astrip(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	AFFECT_DATA *af, *af_next;
	char arg[MAX_STRING_LENGTH];

	one_argument(argument, arg);

	if (arg[0] == '\0')
		victim = ch;
	else
		victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	for (af = victim->affected; af != nullptr; af = af_next)
	{
		af_next = af->next;

		if (IS_SET(af->bitvector, AFF_PERMANENT))
			continue;

		affect_remove(victim, af);
	}

	if (victim != ch)
		act("All affects stripped from $N.", ch, 0, victim, TO_CHAR);
	else
		send_to_char("All affects stripped from yourself.\n\r", ch);
}